

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

bool __thiscall cmBinUtilsLinuxELFLinker::Prepare(cmBinUtilsLinuxELFLinker *this)

{
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *pcVar1;
  cmLDConfigTool *pcVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmMakefile *this_00;
  ostream *poVar7;
  undefined1 uVar8;
  string ldConfigTool;
  string tool;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  ostream local_190;
  
  psVar6 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  std::__cxx11::string::string((string *)&local_1d0,(string *)psVar6);
  if (local_1d0._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_1d0);
  }
  bVar4 = std::operator==(&local_1d0,"objdump");
  if (bVar4) {
    std::
    make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_190);
    pp_Var3 = local_190._vptr_basic_ostream;
    local_190._vptr_basic_ostream = (_func_int **)0x0;
    pcVar1 = (this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>.
             _M_head_impl;
    (this->Tool)._M_t.
    super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>._M_head_impl =
         (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)pp_Var3;
    if (pcVar1 != (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
      (*pcVar1->_vptr_cmBinUtilsLinuxELFGetRuntimeDependenciesTool[1])();
      if ((cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)local_190._vptr_basic_ostream !=
          (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
        (**(code **)((long)*local_190._vptr_basic_ostream + 8))();
      }
    }
    this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"CMAKE_LDCONFIG_TOOL",(allocator<char> *)&local_1b0);
    psVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_190);
    std::__cxx11::string::string((string *)&local_1f0,(string *)psVar6);
    std::__cxx11::string::~string((string *)&local_190);
    if (local_1f0._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_1f0);
    }
    bVar4 = std::operator==(&local_1f0,"ldconfig");
    if (bVar4) {
      std::make_unique<cmLDConfigLDConfigTool,cmRuntimeDependencyArchive*&>
                ((cmRuntimeDependencyArchive **)&local_190);
      pp_Var3 = local_190._vptr_basic_ostream;
      local_190._vptr_basic_ostream = (_func_int **)0x0;
      pcVar2 = (this->LDConfigTool)._M_t.
               super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
               super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
               super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl;
      (this->LDConfigTool)._M_t.
      super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
      super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
      super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl = (cmLDConfigTool *)pp_Var3;
      if (pcVar2 != (cmLDConfigTool *)0x0) {
        (*pcVar2->_vptr_cmLDConfigTool[1])();
        if ((cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)local_190._vptr_basic_ostream !=
            (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
          (**(code **)((long)*local_190._vptr_basic_ostream + 8))();
        }
      }
      pcVar2 = (this->LDConfigTool)._M_t.
               super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
               super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
               super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl;
      iVar5 = (*pcVar2->_vptr_cmLDConfigTool[2])(pcVar2,&this->LDConfigPaths);
      uVar8 = (undefined1)iVar5;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
      poVar7 = std::operator<<(&local_190,"Invalid value for CMAKE_LDCONFIG_TOOL: ");
      std::operator<<(poVar7,(string *)&local_1f0);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
      uVar8 = 0;
    }
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar7 = std::operator<<(&local_190,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
    std::operator<<(poVar7,(string *)&local_1d0);
    std::__cxx11::stringbuf::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    uVar8 = 0;
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  return (bool)uVar8;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "objdump";
  }
  if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  std::string ldConfigTool =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_TOOL");
  if (ldConfigTool.empty()) {
    ldConfigTool = "ldconfig";
  }
  if (ldConfigTool == "ldconfig") {
    this->LDConfigTool =
      cm::make_unique<cmLDConfigLDConfigTool>(this->Archive);
    if (!this->LDConfigTool->GetLDConfigPaths(this->LDConfigPaths)) {
      return false;
    }
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_LDCONFIG_TOOL: " << ldConfigTool;
    this->SetError(e.str());
    return false;
  }

  return true;
}